

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

void __thiscall
Centaurus::CATNNode<wchar_t>::import_transitions
          (CATNNode<wchar_t> *this,NFAState<wchar_t> *state,int offset)

{
  bool bVar1;
  int iVar2;
  pointer pNVar3;
  pointer pNVar4;
  NFATransition<wchar_t> local_68;
  
  pNVar4 = (state->m_transitions).
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar3 = (state->m_transitions).
           super__Vector_base<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pNVar4 != pNVar3) {
    do {
      iVar2 = pNVar4->m_dest;
      bVar1 = pNVar4->m_long;
      local_68._vptr_NFATransition = (_func_int **)&PTR__NFATransition_001c0228;
      local_68.m_label._vptr_CharClass = (_func_int **)&PTR__CharClass_001bf4d0;
      std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::vector
                (&local_68.m_label.m_ranges,&(pNVar4->m_label).m_ranges);
      local_68.m_tag = 0;
      local_68.m_dest = iVar2 + offset;
      local_68.m_long = bVar1;
      std::
      vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>::
      emplace_back<Centaurus::NFATransition<wchar_t>>
                ((vector<Centaurus::NFATransition<wchar_t>,std::allocator<Centaurus::NFATransition<wchar_t>>>
                  *)&this->m_transitions,&local_68);
      local_68._vptr_NFATransition = (_func_int **)&PTR__NFATransition_001c0228;
      local_68.m_label._vptr_CharClass = (_func_int **)&PTR__CharClass_001bf4d0;
      std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
                (&local_68.m_label.m_ranges);
      pNVar4 = pNVar4 + 1;
    } while (pNVar4 != pNVar3);
  }
  return;
}

Assistant:

void import_transitions(const NFAState<TCHAR>& state, int offset)
    {
        for (const auto& tr : state.get_transitions())
        {
            m_transitions.push_back(tr.offset(offset));
        }
    }